

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O1

void __thiscall
WordSplitStringTest_random_long_Test<char16_t>::TestBody
          (WordSplitStringTest_random_long_Test<char16_t> *this)

{
  pointer *__ptr;
  char *pcVar1;
  AssertionResult gtest_ar;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> delim;
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  split_result;
  RandomWordTestData<char16_t,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  data;
  long *local_108;
  AssertHelper local_100 [8];
  internal local_f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_e8;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_c8;
  container_type local_a8;
  RandomWordTestData<char16_t,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  local_90;
  
  make_delim_long<char16_t,std::__cxx11::u16string>(&local_c8,8,L'\0');
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::u16string::_M_construct<char16_t*>
            ((u16string *)&local_e8,local_c8._M_dataplus._M_p,
             local_c8._M_dataplus._M_p + local_c8._M_string_length);
  RandomWordTestData<char16_t,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  ::RandomWordTestData(&local_90,&local_e8,0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity * 2 + 2);
  }
  jessilib::
  word_split<std::vector,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
            (&local_a8,
             (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
              )local_90.m_str._M_dataplus._M_p,
             (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
              )(local_90.m_str._M_dataplus._M_p + local_90.m_str._M_string_length),
             (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
              )local_c8._M_dataplus._M_p,
             (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
              )(local_c8._M_dataplus._M_p + local_c8._M_string_length));
  testing::internal::
  CmpHelperEQ<std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>,std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>>
            (local_f8,"split_result","data.m_tokens",&local_a8,&local_90.m_tokens);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0xf1,pcVar1);
    testing::internal::AssertHelper::operator=(local_100,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(local_100);
    if (local_108 != (long *)0x0) {
      (**(code **)(*local_108 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  std::
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  ::~vector(&local_a8);
  if (local_90.m_token_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.m_token_indexes.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.m_token_indexes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.m_token_indexes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  ::~vector(&local_90.m_tokens);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_90.m_str._M_dataplus._M_p != &local_90.m_str.field_2) {
    operator_delete(local_90.m_str._M_dataplus._M_p,
                    local_90.m_str.field_2._M_allocated_capacity * 2 + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_90.m_delim._M_dataplus._M_p != &local_90.m_delim.field_2) {
    operator_delete(local_90.m_delim._M_dataplus._M_p,
                    local_90.m_delim.field_2._M_allocated_capacity * 2 + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity * 2 + 2);
  }
  return;
}

Assistant:

TYPED_TEST(WordSplitStringTest, random_long) {
	auto delim = make_delim_long<TypeParam>(8);
	RandomWordTestData<TypeParam> data{ delim };
	std::vector<std::basic_string<TypeParam>> split_result = word_split(data.m_str, delim);
	EXPECT_EQ(split_result, data.m_tokens);
}